

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O0

ion_err_t oafdict_scan(ion_oafdict_cursor_t *cursor)

{
  ion_dictionary_parent_t *piVar1;
  ion_boolean_t iVar2;
  int iVar3;
  char *__ptr;
  ion_boolean_t key_satisfies_predicate;
  ion_hash_bucket_t *item;
  int record_size;
  int loc;
  ion_file_hashmap_t *hash_map;
  ion_oafdict_cursor_t *cursor_local;
  
  piVar1 = ((cursor->super).dictionary)->instance;
  item._4_4_ = (cursor->current + 1) % (int)piVar1[1].key_type;
  iVar3 = (piVar1->record).key_size + 1 + (piVar1->record).value_size;
  fseek((FILE *)piVar1[1].compare,(long)(item._4_4_ * iVar3),0);
  __ptr = (char *)malloc((long)iVar3);
  while( true ) {
    if (item._4_4_ == cursor->first) {
      free(__ptr);
      return '\x01';
    }
    fread(__ptr,(long)iVar3,1,(FILE *)piVar1[1].compare);
    if (((*__ptr != -1) && (*__ptr != -2)) &&
       (iVar2 = test_predicate(&cursor->super,__ptr + 1), iVar2 == '\x01')) break;
    item._4_4_ = item._4_4_ + 1;
    if ((int)piVar1[1].key_type <= item._4_4_) {
      item._4_4_ = 0;
    }
  }
  cursor->current = item._4_4_;
  free(__ptr);
  return '\x04';
}

Assistant:

ion_err_t
oafdict_scan(
	ion_oafdict_cursor_t *cursor/* don't need to pass in the cursor */
) {
	/* need to scan hashmap fully looking for values that satisfy - need to think about */
	ion_file_hashmap_t *hash_map	= (ion_file_hashmap_t *) (cursor->super.dictionary->instance);

	int loc							= (cursor->current + 1) % hash_map->map_size;
	/* this is the current position of the cursor */
	/* and start scanning 1 ahead */

	int record_size = SIZEOF(STATUS) + hash_map->super.record.key_size + hash_map->super.record.value_size;

	/* move to the correct position in the fie */
	fseek(hash_map->file, loc * record_size, SEEK_SET);

	ion_hash_bucket_t *item;

	item = malloc(record_size);

	/* start at the current position, scan forward */
	while (loc != cursor->first) {
		fread(item, record_size, 1, hash_map->file);

		if ((item->status == ION_EMPTY) || (item->status == ION_DELETED)) {
			/* if empty, just skip to next cell */
			loc++;
		}
		else {
			/* check to see if the current key value satisfies the predicate */

			ion_boolean_t key_satisfies_predicate = test_predicate(&(cursor->super), item->data);	/* assumes that the key is first */

			if (key_satisfies_predicate == boolean_true) {
				cursor->current = loc;	/* this is the next index for value */
				free(item);
				return cs_cursor_active;
			}

			/* If valid bucket is not found, advance current position. */
			loc++;
		}

		if (loc >= hash_map->map_size) {
			/* Perform wrapping */
			loc = 0;
		}
	}

	/* if you end up here, you've wrapped the entire data structure and not found a value */
	free(item);
	return cs_end_of_results;
}